

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pt_block_decoder.c
# Opt level: O0

int pt_blk_process_vmcs(pt_block_decoder *decoder,pt_event *ev)

{
  uint64_t uVar1;
  int iVar2;
  int errcode;
  uint64_t vmcs;
  pt_event *ev_local;
  pt_block_decoder *decoder_local;
  
  if ((decoder == (pt_block_decoder *)0x0) || (ev == (pt_event *)0x0)) {
    decoder_local._4_4_ = -1;
  }
  else {
    uVar1 = (ev->variant).enabled.ip;
    if ((decoder->asid).vmcs != uVar1) {
      iVar2 = pt_msec_cache_invalidate(&decoder->scache);
      if (iVar2 < 0) {
        return iVar2;
      }
      (decoder->asid).vmcs = uVar1;
    }
    decoder_local._4_4_ = 0;
  }
  return decoder_local._4_4_;
}

Assistant:

static int pt_blk_process_vmcs(struct pt_block_decoder *decoder,
			       const struct pt_event *ev)
{
	uint64_t vmcs;
	int errcode;

	if (!decoder || !ev)
		return -pte_internal;

	vmcs = ev->variant.vmcs.base;
	if (decoder->asid.vmcs != vmcs) {
		errcode = pt_msec_cache_invalidate(&decoder->scache);
		if (errcode < 0)
			return errcode;

		decoder->asid.vmcs = vmcs;
	}

	return 0;
}